

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentFactoredStates.cpp
# Opt level: O0

void __thiscall MADPComponentFactoredStates::PrintDebugStuff(MADPComponentFactoredStates *this)

{
  ostream *poVar1;
  void *pvVar2;
  void *in_RDI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000188;
  string local_28 [40];
  
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "-----------------------------------------------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "MADPComponentFactoredStates::SetInitialized(true) run");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"*this* (at mem address");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDI);
  poVar1 = std::operator<<(poVar1,") has ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"_m_initialized=");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,(bool)(*(byte *)((long)in_RDI + 8) & 1));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"_m_nrStates=");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*(ulong *)((long)in_RDI + 0x10));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"_m_nrStateFactors=");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*(ulong *)((long)in_RDI + 0x18));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"_m_sfacDomainSizes=");
  PrintTools::SoftPrintVector<unsigned_long>(in_stack_00000188);
  poVar1 = std::operator<<(poVar1,local_28);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_28);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "-----------------------------------------------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void MADPComponentFactoredStates::PrintDebugStuff() const
{
    cout << "-----------------------------------------------------"<<endl;
    cout << "MADPComponentFactoredStates::SetInitialized(true) run"<<endl;
    cout << "*this* (at mem address"<<this<<") has "<<endl;
    cout << "_m_initialized="<<_m_initialized<<endl;
    cout << "_m_nrStates="<<_m_nrStates<<endl;
    cout << "_m_nrStateFactors="<<_m_nrStateFactors<<endl;
    cout << "_m_sfacDomainSizes="<<SoftPrintVector(_m_sfacDomainSizes)<<
        endl;
    cout << "-----------------------------------------------------"<<endl;
}